

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
Validator_unnamedAndDuplicateNamedVariablesWithAndWithoutValidUnits_Test::
~Validator_unnamedAndDuplicateNamedVariablesWithAndWithoutValidUnits_Test
          (Validator_unnamedAndDuplicateNamedVariablesWithAndWithoutValidUnits_Test *this)

{
  Validator_unnamedAndDuplicateNamedVariablesWithAndWithoutValidUnits_Test *this_local;
  
  ~Validator_unnamedAndDuplicateNamedVariablesWithAndWithoutValidUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, unnamedAndDuplicateNamedVariablesWithAndWithoutValidUnits)
{
    const std::vector<std::string> expectedIssues = {
        "Variable '2cold' in component 'fargo' does not have a valid name attribute. CellML identifiers must not begin with a European numeric character [0-9].",
        "Component 'fargo' contains multiple variables with the name 'margie'. Valid variable names must be unique to their component.",
        "Variable 'margie' in component 'fargo' does not have any units specified.",
        "Variable 'ransom' in component 'fargo' has a units reference 'dollars' which is neither standard nor defined in the parent model.",
        "Variable 'mullah' in component 'fargo' does not have a valid units attribute. The attribute given is '$$'. CellML identifiers must not contain any characters other than [a-zA-Z0-9_].",
        "Variable '' in component 'fargo' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
    };

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::VariablePtr v4 = libcellml::Variable::create();
    libcellml::VariablePtr v5 = libcellml::Variable::create();
    libcellml::VariablePtr v6 = libcellml::Variable::create();

    model->addComponent(c1);
    c1->addVariable(v1);
    c1->addVariable(v2);
    c1->addVariable(v3);
    c1->addVariable(v4);
    c1->addVariable(v5);
    c1->addVariable(v6);

    model->setName("minnesota");
    c1->setName("fargo");
    v1->setName("2cold");
    v1->setUnits("ampere");
    v2->setName("margie");
    v2->setUnits("ampere");
    v3->setName("margie");
    v4->setName("ransom");
    v4->setUnits("dollars");
    v5->setName("mullah");
    v5->setUnits("$$");
    v6->setName("");
    v6->setUnits("second");

    validator->validateModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, validator);
}